

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O2

void Minisat::parseOptions(int *argc,char **argv,bool strict)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  vec<Minisat::Option_*,_int> *pvVar5;
  char *pcVar6;
  long lVar7;
  char **ppcVar8;
  int iVar9;
  int k;
  long lVar10;
  char *str;
  
  iVar9 = 1;
  lVar7 = 1;
  do {
    if (*argc <= lVar7) {
      *argc = (iVar9 - (int)lVar7) + *argc;
      return;
    }
    str = argv[lVar7];
    bVar3 = match<char_const*>(&str,"--");
    if (((bVar3) &&
        (bVar3 = match<char_const*>(&str,Option::getHelpPrefixString()::help_prefix_str), bVar3)) &&
       (ppcVar8 = &str, bVar3 = match<char_const*>(&str,"help"), bVar3)) {
      if (*str == '\0') {
        printUsageAndExit((int)ppcVar8,argv,false);
LAB_004d1788:
        printUsageAndExit((int)ppcVar8,argv,true);
        pcVar6 = *ppcVar8;
        do {
          cVar1 = *(char *)argv;
          if (cVar1 == '\0') {
            *ppcVar8 = pcVar6;
            return;
          }
          argv = (char **)((long)argv + 1);
          cVar2 = *pcVar6;
          pcVar6 = pcVar6 + 1;
        } while (cVar2 == cVar1);
        return;
      }
      ppcVar8 = &str;
      bVar3 = match<char_const*>(&str,"-verb");
      if (bVar3) goto LAB_004d1788;
    }
    else {
      lVar10 = 0;
      uVar4 = 0;
      while ((uVar4 & 1) == 0) {
        pvVar5 = Option::getOptionList();
        if (pvVar5->sz <= lVar10) {
          pcVar6 = argv[lVar7];
          if ((strict) && (*pcVar6 == '-')) {
            argv[lVar7] = pcVar6 + 1;
            fprintf(_stderr,"ERROR! Unknown flag \"%s\". Use \'--%shelp\' for help.\n",pcVar6 + 1,
                    Option::getHelpPrefixString()::help_prefix_str);
            exit(1);
          }
          lVar10 = (long)iVar9;
          iVar9 = iVar9 + 1;
          argv[lVar10] = pcVar6;
          break;
        }
        pvVar5 = Option::getOptionList();
        uVar4 = (*pvVar5->data[lVar10]->_vptr_Option[2])(pvVar5->data[lVar10],argv[lVar7]);
        lVar10 = lVar10 + 1;
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void Minisat::parseOptions(int& argc, char** argv, bool strict)
{
    int i, j;
    for (i = j = 1; i < argc; i++){
        const char* str = argv[i];
        if (match(str, "--") && match(str, Option::getHelpPrefixString()) && match(str, "help")){
            if (*str == '\0')
                printUsageAndExit(argc, argv);
            else if (match(str, "-verb"))
                printUsageAndExit(argc, argv, true);
        } else {
            bool parsed_ok = false;
        
            for (int k = 0; !parsed_ok && k < Option::getOptionList().size(); k++){
                parsed_ok = Option::getOptionList()[k]->parse(argv[i]);

                // fprintf(stderr, "checking %d: %s against flag <%s> (%s)\n", i, argv[i], Option::getOptionList()[k]->name, parsed_ok ? "ok" : "skip");
            }

            if (!parsed_ok){
                if (strict && match(argv[i], "-"))
                    fprintf(stderr, "ERROR! Unknown flag \"%s\". Use '--%shelp' for help.\n", argv[i], Option::getHelpPrefixString()), exit(1);
                else
                    argv[j++] = argv[i];
            }
        }
    }

    argc -= (i - j);
}